

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O1

void __thiscall
ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  bool bVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  AssertionResult local_40;
  double local_30;
  char *local_28 [2];
  undefined1 local_18 [16];
  
  dVar2 = *pica::ParticleTypes::types * 29979245800.0;
  dVar4 = 5643.176 / dVar2;
  auVar3._8_8_ = dVar2;
  auVar3._0_8_ = dVar2;
  auVar3 = divpd(_DAT_001c9490,auVar3);
  dVar2 = dVar4 * dVar4 + auVar3._0_8_ * auVar3._0_8_ + auVar3._8_8_ * auVar3._8_8_ + 1.0;
  if (dVar2 < 0.0) {
    local_30 = dVar4;
    local_18 = auVar3;
    sqrt(dVar2);
    auVar3 = local_18;
    dVar4 = local_30;
  }
  dVar2 = *pica::ParticleTypes::types;
  if (((NAN(dVar2 * auVar3._0_8_ * 29979245800.0) || NAN(dVar2 * auVar3._8_8_ * 29979245800.0)) ||
      (NAN(dVar2) || NAN(dVar4 * 29979245800.0 * dVar2))) || (NAN(pica::ParticleTypes::types[1]))) {
    local_40.success_ = false;
  }
  else {
    local_40.success_ = true;
  }
  local_40.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_40.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)local_28,&local_40,"this->eqParticles_(particle, copyParticle)","false",
               "true");
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x70,local_28[0]);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_28[0] != (char *)0x0) {
      operator_delete__(local_28[0]);
    }
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Assignment)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(432.453, -3452.15, -15.125);
    MomentumType momentum(431.124, -54.12, 5643.176);
    FactorType factor = 1.9945;
    ParticleType particle(position, momentum, factor, 0);
    ParticleType copyParticle;
    copyParticle = particle;
    ASSERT_TRUE(this->eqParticles_(particle, copyParticle));
}